

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZElementMatrixT.cpp
# Opt level: O2

void __thiscall
TPZElementMatrixT<std::complex<double>_>::ApplyOneShapeConstraints
          (TPZElementMatrixT<std::complex<double>_> *this,int constraintindex)

{
  TPZFNMatrix<1000,_std::complex<double>_> *this_00;
  list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *plVar1;
  int iVar2;
  _List_node_base *p_Var3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  complex<double> *pcVar8;
  long lVar9;
  int ieq;
  _List_node_base *p_Var10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long row;
  int ieq_3;
  long row_00;
  long lVar15;
  long lVar16;
  double dVar17;
  
  p_Var3 = (_List_node_base *)
           (this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
           super_TPZVec<long>.fStore[constraintindex];
  iVar2 = (this->fConstrBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[constraintindex].pos;
  this_00 = &this->fConstrMat;
  lVar16 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
           super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
  lVar9 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
          super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol;
  plVar1 = &(this->super_TPZElementMatrix).fOneRestraints;
  if (lVar9 < 1) {
    lVar9 = 0;
  }
  p_Var10 = (_List_node_base *)plVar1;
  if (lVar16 < 1) {
    lVar16 = 0;
  }
  do {
    do {
      p_Var10 = (((_List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)
                 &p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var10 == (_List_node_base *)plVar1) {
        return;
      }
    } while ((p_Var10[1]._M_prev)->_M_next != p_Var3);
    row = (long)*(int *)&(p_Var10[1]._M_prev)->_M_prev + (long)iVar2;
    for (lVar15 = 1; lVar15 != 4; lVar15 = lVar15 + 1) {
      uVar4 = (this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
              super_TPZVec<long>.fNElements;
      uVar11 = 0;
      if (0 < (long)uVar4) {
        uVar11 = uVar4;
      }
      for (uVar14 = 0;
          (uVar12 = uVar11, uVar11 != uVar14 &&
          (uVar12 = uVar14,
          (_List_node_base *)
          (this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
          super_TPZVec<long>.fStore[uVar14] != p_Var10[1]._M_prev[lVar15]._M_next));
          uVar14 = uVar14 + 1) {
      }
      if (uVar4 == uVar12) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZElementMatrixT.cpp"
                   ,0x178);
      }
      row_00 = (long)*(int *)&p_Var10[1]._M_prev[lVar15]._M_prev +
               (long)(this->fConstrBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                     [uVar12 & 0xffffffff].pos;
      dVar17 = (double)-(*(int *)((long)&(p_Var10[7]._M_prev)->_M_next + lVar15 * 4) /
                        *(int *)&(p_Var10[7]._M_prev)->_M_next);
      if ((this->super_TPZElementMatrix).fType == EK) {
        for (lVar13 = 0; lVar16 != lVar13; lVar13 = lVar13 + 1) {
          pcVar8 = TPZFMatrix<std::complex<double>_>::operator()
                             (&this_00->super_TPZFMatrix<std::complex<double>_>,row,lVar13);
          dVar5 = *(double *)pcVar8->_M_value;
          dVar6 = *(double *)(pcVar8->_M_value + 8);
          pcVar8 = TPZFMatrix<std::complex<double>_>::operator()
                             (&this_00->super_TPZFMatrix<std::complex<double>_>,row_00,lVar13);
          dVar7 = *(double *)(pcVar8->_M_value + 8);
          *(double *)pcVar8->_M_value = *(double *)pcVar8->_M_value + dVar5 * dVar17;
          *(double *)(pcVar8->_M_value + 8) = dVar7 + dVar6 * dVar17;
        }
      }
      else {
        for (lVar13 = 0; lVar9 != lVar13; lVar13 = lVar13 + 1) {
          pcVar8 = TPZFMatrix<std::complex<double>_>::operator()
                             (&this_00->super_TPZFMatrix<std::complex<double>_>,row,lVar13);
          dVar5 = *(double *)pcVar8->_M_value;
          dVar6 = *(double *)(pcVar8->_M_value + 8);
          pcVar8 = TPZFMatrix<std::complex<double>_>::operator()
                             (&this_00->super_TPZFMatrix<std::complex<double>_>,row_00,lVar13);
          dVar7 = *(double *)(pcVar8->_M_value + 8);
          *(double *)pcVar8->_M_value = *(double *)pcVar8->_M_value + dVar5 * dVar17;
          *(double *)(pcVar8->_M_value + 8) = dVar7 + dVar6 * dVar17;
        }
      }
      if ((this->super_TPZElementMatrix).fType == EK) {
        for (lVar13 = 0; lVar16 != lVar13; lVar13 = lVar13 + 1) {
          pcVar8 = TPZFMatrix<std::complex<double>_>::operator()
                             (&this_00->super_TPZFMatrix<std::complex<double>_>,lVar13,row);
          dVar5 = *(double *)pcVar8->_M_value;
          dVar6 = *(double *)(pcVar8->_M_value + 8);
          pcVar8 = TPZFMatrix<std::complex<double>_>::operator()
                             (&this_00->super_TPZFMatrix<std::complex<double>_>,lVar13,row_00);
          dVar7 = *(double *)(pcVar8->_M_value + 8);
          *(double *)pcVar8->_M_value = *(double *)pcVar8->_M_value + dVar5 * dVar17;
          *(double *)(pcVar8->_M_value + 8) = dVar7 + dVar6 * dVar17;
        }
      }
    }
    if ((this->super_TPZElementMatrix).fType == EK) {
      for (lVar15 = 0; lVar16 != lVar15; lVar15 = lVar15 + 1) {
        pcVar8 = TPZFMatrix<std::complex<double>_>::operator()
                           (&this_00->super_TPZFMatrix<std::complex<double>_>,lVar15,row);
        *(undefined8 *)pcVar8->_M_value = 0;
        *(undefined8 *)(pcVar8->_M_value + 8) = 0;
        pcVar8 = TPZFMatrix<std::complex<double>_>::operator()
                           (&this_00->super_TPZFMatrix<std::complex<double>_>,row,lVar15);
        *(undefined8 *)pcVar8->_M_value = 0;
        *(undefined8 *)(pcVar8->_M_value + 8) = 0;
      }
      pcVar8 = TPZFMatrix<std::complex<double>_>::operator()
                         (&this_00->super_TPZFMatrix<std::complex<double>_>,row,row);
      *(undefined8 *)pcVar8->_M_value = 0x3ff0000000000000;
      *(undefined8 *)(pcVar8->_M_value + 8) = 0;
    }
    else {
      for (lVar15 = 0; lVar9 != lVar15; lVar15 = lVar15 + 1) {
        pcVar8 = TPZFMatrix<std::complex<double>_>::operator()
                           (&this_00->super_TPZFMatrix<std::complex<double>_>,row,lVar15);
        *(undefined8 *)pcVar8->_M_value = 0;
        *(undefined8 *)(pcVar8->_M_value + 8) = 0;
      }
    }
  } while( true );
}

Assistant:

void TPZElementMatrixT<TVar>::ApplyOneShapeConstraints(int constraintindex)
{
    int64_t dfnindex = this->fConstrConnect[constraintindex];


#ifdef PZ_LOG
    int count = 0;
    for (std::list<TPZOneShapeRestraint>::iterator it = fOneRestraints.begin(); it != fOneRestraints.end(); it++) {
        if (it->fFaces[0].first != dfnindex) {
            continue;
        }
        count++;
    }
    if (count && logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "Element matrix before ApplyOneShapeConstraint\n";
        fConstrMat.Print("EKBefore = ",sout,EMathematicaInput);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    int64_t inpos = this->fConstrBlock.Position(constraintindex);
    int64_t toteq = this->fConstrMat.Rows();
    int64_t nrhs = this->fConstrMat.Cols();

    for (std::list<TPZOneShapeRestraint>::iterator it = fOneRestraints.begin(); it != fOneRestraints.end(); it++) {
        if (it->fFaces[0].first != dfnindex) {
            continue;
        }
        int64_t send = inpos+it->fFaces[0].second;
        for (int id=1; id<4; id++) {
            int64_t depindex = it->fFaces[id].first;
            int locdep = 0;
            for (locdep = 0; locdep < fConstrConnect.size(); locdep++) {
                if (fConstrConnect[locdep] == depindex) {
                    break;
                }
            }
            if (locdep == fConstrConnect.size()) {
                DebugStop();
            }
            int64_t deppos = this->fConstrBlock.Position(locdep);
            int64_t receive = deppos+it->fFaces[id].second;
            REAL coef = -it->fOrient[id]/it->fOrient[0];
            if (this->fType == TPZElementMatrix::EK){
                for(int ieq=0; ieq<toteq; ieq++) {
                    (this->fConstrMat)(receive,ieq) += coef*(this->fConstrMat)(send,ieq);
                }
            }//EK
            else
            {
                
                for(int ieq=0; ieq<nrhs; ieq++) {
                    (this->fConstrMat)(receive,ieq) += coef*(this->fConstrMat)(send,ieq);
                }
            }//EF

            if (this->fType == TPZElementMatrix::EK){
                for(int ieq=0; ieq<toteq; ieq++)
                {
                    (this->fConstrMat)(ieq,receive) += coef*(this->fConstrMat)(ieq,send);
                }
            }//EK

        }
        if (this->fType == TPZElementMatrix::EK){
            for(int ieq=0; ieq<toteq; ieq++)
            {
                (this->fConstrMat)(ieq,send) = 0.;
                (this->fConstrMat)(send,ieq) = 0.;
            }
            (this->fConstrMat)(send,send) = 1.;
        }//EK
        else
        {
            for(int ieq=0; ieq<nrhs; ieq++) {
                (this->fConstrMat)(send,ieq) = 0.;
            }
        }

    }
#ifdef PZ_LOG
    if (count && logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "Element matrix after ApplyOneShapeConstraint\n";
        fConstrMat.Print("EKAfter = ",sout,EMathematicaInput);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
}